

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O0

MetaConfiguration * parse_configuration(MetaConfiguration *__return_storage_ptr__,ifstream *f)

{
  bool bVar1;
  RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>
  local_80;
  type local_60;
  undefined1 local_40 [8];
  callback_t state;
  int error;
  ifstream *f_local;
  MetaConfiguration *conf;
  
  state._M_invoker._3_1_ = 0;
  MetaConfiguration::MetaConfiguration(__return_storage_ptr__);
  std::
  function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
  ::
  function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
            ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
              *)local_40,initial_state);
  while( true ) {
    bVar1 = std::function::operator_cast_to_bool((function *)local_40);
    if (!bVar1) break;
    std::
    function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
    ::operator()(&local_80,
                 (function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
                  *)local_40,__return_storage_ptr__,f,(int *)((long)&state._M_invoker + 4));
    RecursiveHelper::operator_cast_to_function(&local_60,(RecursiveHelper *)&local_80);
    std::
    function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
    ::operator=((function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
                 *)local_40,&local_60);
    std::
    function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
    ::~function(&local_60);
    RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>
    ::~RecursiveHelper(&local_80);
  }
  state._M_invoker._3_1_ = 1;
  std::
  function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
  ::~function((function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
               *)local_40);
  if ((state._M_invoker._3_1_ & 1) == 0) {
    MetaConfiguration::~MetaConfiguration(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MetaConfiguration parse_configuration(std::ifstream &f) {
  int error;
  MetaConfiguration conf;
  callback_t state = initial_state;
  while (state) {
    state = state(conf, f, error);
  }
  return conf;
}